

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O2

void __thiscall chrono::ChSystem::GetDampingMatrix(ChSystem *this,ChSparseMatrix *R)

{
  __shared_ptr<chrono::ChSystemDescriptor,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  KRMmatricesLoad(this,0.0,1.0,0.0);
  (*((this->descriptor).super___shared_ptr<chrono::ChSystemDescriptor,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_ChSystemDescriptor[10])(0);
  std::__shared_ptr<chrono::ChSystemDescriptor,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,
             &(this->descriptor).
              super___shared_ptr<chrono::ChSystemDescriptor,_(__gnu_cxx::_Lock_policy)2>);
  (*(local_28._M_ptr)->_vptr_ChSystemDescriptor[0x1b])(local_28._M_ptr,0,R,0,0,0,0,0,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return;
}

Assistant:

void ChSystem::GetDampingMatrix(ChSparseMatrix* R) {
    // IntToDescriptor(0, Dv, R, 0, L, Qc);
    // ConstraintsLoadJacobians();

    // Load all KRM matrices with the R part only
    this->KRMmatricesLoad(0, 1.0, 0);
    // For ChVariable objects without a ChKblock, but still with a mass:
    descriptor->SetMassFactor(0.0);

    // Fill system-level R matrix
    this->GetSystemDescriptor()->ConvertToMatrixForm(nullptr, R, nullptr, nullptr, nullptr, nullptr, false, false);
}